

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::EncodePendingOperationalDataset
                  (Error *__return_storage_ptr__,Request *aRequest,
                  PendingOperationalDataset *aDataset)

{
  ErrorCode EVar1;
  ushort uVar2;
  Error *pEVar3;
  uint64_t aValue;
  Tlv TStack_68;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  EncodeActiveOperationalDataset
            ((Error *)local_48,aRequest,&aDataset->super_ActiveOperationalDataset);
  pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (EVar1 == kNone) {
    uVar2 = (aDataset->super_ActiveOperationalDataset).mPresentFlags;
    if ((uVar2 & 0x20) != 0) {
      tlv::Tlv::Tlv(&TStack_68,kDelayTimer,
                    *(uint32_t *)&(aDataset->super_ActiveOperationalDataset).field_0xd4,kMeshCoP);
      AppendTlv((Error *)local_48,aRequest,&TStack_68);
      pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
      EVar1 = pEVar3->mCode;
      std::__cxx11::string::~string((string *)(local_48 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      if (EVar1 != kNone) {
        return __return_storage_ptr__;
      }
      uVar2 = (aDataset->super_ActiveOperationalDataset).mPresentFlags;
    }
    if ((uVar2 & 0x10) != 0) {
      aValue = Timestamp::Encode(&aDataset->mPendingTimestamp);
      tlv::Tlv::Tlv(&TStack_68,kPendingTimestamp,aValue,kMeshCoP);
      AppendTlv((Error *)local_48,aRequest,&TStack_68);
      Error::operator=(__return_storage_ptr__,(Error *)local_48);
      std::__cxx11::string::~string((string *)(local_48 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodePendingOperationalDataset(coap::Request                   &aRequest,
                                                        const PendingOperationalDataset &aDataset)
{
    Error error;

    SuccessOrExit(error = EncodeActiveOperationalDataset(aRequest, aDataset));

    if (aDataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kDelayTimer, aDataset.mDelayTimer}));
    }

    if (aDataset.mPresentFlags & PendingOperationalDataset::kPendingTimestampBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPendingTimestamp, aDataset.mPendingTimestamp.Encode()}));
    }

exit:
    return error;
}